

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

OutPt * __thiscall ClipperLib::InsertPolyPtBetween(ClipperLib *this,OutPt *p1,OutPt *p2,IntPoint pt)

{
  OutPt *pOVar1;
  undefined8 *puVar2;
  OutPt *pOVar3;
  
  if ((OutPt *)this == p1) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "JoinError";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  pOVar1 = (OutPt *)operator_new(0x28);
  (pOVar1->pt).X = (long64)p2;
  (pOVar1->pt).Y = pt.X;
  pOVar3 = (OutPt *)this;
  if (*(OutPt **)(this + 0x18) == p1) {
    pOVar3 = p1;
    p1 = (OutPt *)this;
  }
  p1->next = pOVar1;
  pOVar3->prev = pOVar1;
  pOVar1->next = pOVar3;
  pOVar1->prev = p1;
  return pOVar1;
}

Assistant:

OutPt* InsertPolyPtBetween(OutPt* p1, OutPt* p2, const IntPoint pt)
{
  if (p1 == p2) throw "JoinError";
  OutPt* result = new OutPt;
  result->pt = pt;
  if (p2 == p1->next)
  {
    p1->next = result;
    p2->prev = result;
    result->next = p2;
    result->prev = p1;
  } else
  {
    p2->next = result;
    p1->prev = result;
    result->next = p1;
    result->prev = p2;
  }
  return result;
}